

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O1

int32_t __thiscall
webrtc::TraceImpl::AddMessage(TraceImpl *this,char *trace_message,char *msg,uint16_t written_so_far)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_0000000a;
  undefined8 in_R9;
  size_t __maxlen;
  
  iVar1 = -1;
  uVar2 = (uint)CONCAT62(in_register_0000000a,written_so_far);
  if (uVar2 < 0x400) {
    __maxlen = (ulong)(0x400 - uVar2 & 0xffff) - 2;
    iVar1 = snprintf(trace_message,__maxlen,"%s",msg,msg,in_R9,0xffffffff);
    if (iVar1 < 0 || (int)__maxlen < iVar1) {
      trace_message[__maxlen] = '\0';
      iVar1 = (int)__maxlen;
    }
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int32_t TraceImpl::AddMessage(
    char* trace_message,
    const char msg[WEBRTC_TRACE_MAX_MESSAGE_SIZE],
    const uint16_t written_so_far) const {
  int length = 0;
  if (written_so_far >= WEBRTC_TRACE_MAX_MESSAGE_SIZE) {
    return -1;
  }
  // - 2 to leave room for newline and NULL termination.
#ifdef _WIN32
  length = _snprintf(trace_message,
                     WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                     "%s", msg);
  if (length < 0) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#else
  length = snprintf(trace_message,
                    WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                    "%s", msg);
  if (length < 0 ||
      length > WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#endif
  // Length with NULL termination.
  return length + 1;
}